

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O2

string_t duckdb::StringCast::Operation<double>(double input,Vector *vector)

{
  double *in_RCX;
  anon_union_16_2_67f50693_for_value aVar1;
  string s;
  double local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_38 = input;
  duckdb_fmt::v6::format<char[3],double&,char>(&local_30,(v6 *)"{}",(char (*) [3])&local_38,in_RCX);
  aVar1.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(vector,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

string_t StringCast::Operation(double input, Vector &vector) {
	std::string s = duckdb_fmt::format("{}", input);
	return StringVector::AddString(vector, s);
}